

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftstream.c
# Opt level: O1

FT_Error FT_Stream_Seek(FT_Stream stream,FT_ULong pos)

{
  FT_Error FVar1;
  unsigned_long uVar2;
  bool bVar3;
  
  if (stream->read == (FT_Stream_IoFunc)0x0) {
    bVar3 = pos <= stream->size;
  }
  else {
    uVar2 = (*stream->read)(stream,pos,(uchar *)0x0,0);
    bVar3 = uVar2 == 0;
  }
  FVar1 = 0x55;
  if (bVar3) {
    stream->pos = pos;
    FVar1 = 0;
  }
  return FVar1;
}

Assistant:

FT_BASE_DEF( FT_Error )
  FT_Stream_Seek( FT_Stream  stream,
                  FT_ULong   pos )
  {
    FT_Error  error = FT_Err_Ok;


    if ( stream->read )
    {
      if ( stream->read( stream, pos, NULL, 0 ) )
      {
        FT_ERROR(( "FT_Stream_Seek:"
                   " invalid i/o; pos = 0x%lx, size = 0x%lx\n",
                   pos, stream->size ));

        error = FT_THROW( Invalid_Stream_Operation );
      }
    }
    /* note that seeking to the first position after the file is valid */
    else if ( pos > stream->size )
    {
      FT_ERROR(( "FT_Stream_Seek:"
                 " invalid i/o; pos = 0x%lx, size = 0x%lx\n",
                 pos, stream->size ));

      error = FT_THROW( Invalid_Stream_Operation );
    }

    if ( !error )
      stream->pos = pos;

    return error;
  }